

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString>
               (JavascriptString *s,CharCount appendCharLength,CompoundString *toString)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  CharCount CVar4;
  CharCount CVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  JavascriptString *pJVar8;
  Type *pTVar9;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36b,"(s)","s");
    if (!bVar2) goto LAB_00aa6691;
    *puVar6 = 0;
  }
  cVar3 = JavascriptString::GetLength(s);
  if (cVar3 != appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36c,"(appendCharLength == s->GetLength())",
                                "appendCharLength == s->GetLength()");
    if (!bVar2) goto LAB_00aa6691;
    *puVar6 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36d,"(toString)","toString");
    if (!bVar2) goto LAB_00aa6691;
    *puVar6 = 0;
  }
  pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)toString);
  if (pcVar7 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36e,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00aa6691;
    *puVar6 = 0;
  }
  bVar2 = OwnsLastBlock(toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36f,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00aa6691;
    *puVar6 = 0;
  }
  bVar2 = HasOnlyDirectChars(toString);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x370,"(!toString->HasOnlyDirectChars())",
                                "!toString->HasOnlyDirectChars()");
    if (!bVar2) {
LAB_00aa6691:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  CVar4 = LastBlockPointerLength(toString);
  CVar5 = LastBlockPointerCapacity(toString);
  if (CVar4 < CVar5) {
    pJVar8 = GetImmutableOrScriptUnreferencedString(s);
    pTVar9 = LastBlockPointers(toString);
    pTVar9 = pTVar9 + CVar4;
    Memory::Recycler::WBSetBit((char *)pTVar9);
    pTVar9->ptr = pJVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar9);
    cVar3 = JavascriptString::GetLength((JavascriptString *)toString);
    JavascriptString::SetLength((JavascriptString *)toString,appendCharLength + cVar3);
    SetLastBlockPointerLength(toString,CVar4 + 1);
  }
  return CVar4 < CVar5;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(
        JavascriptString *const s,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(appendCharLength == s->GetLength());
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!toString->HasOnlyDirectChars());

        const CharCount blockPointerLength = toString->LastBlockPointerLength();
        if(blockPointerLength < toString->LastBlockPointerCapacity())
        {
            toString->LastBlockPointers()[blockPointerLength] = GetImmutableOrScriptUnreferencedString(s);
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockPointerLength(blockPointerLength + 1);
            return true;
        }
        return false;
    }